

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_utilities.c
# Opt level: O0

void PrintUtilities_print_json_string(FILE *file,wchar_t *text)

{
  size_t sVar1;
  wchar_t local_1c;
  wchar_t i;
  wchar_t *text_local;
  FILE *file_local;
  
  for (local_1c = L'\0'; sVar1 = wcslen(text), (ulong)(long)local_1c < sVar1;
      local_1c = local_1c + L'\x01') {
    if ((text[local_1c] == L'\\') || (text[local_1c] == L'\"')) {
      fputc(0x5c,(FILE *)file);
      fputc((int)(char)text[local_1c],(FILE *)file);
    }
    else if (text[local_1c] == L'\n') {
      fputc(0x5c,(FILE *)file);
      fputc(0x6e,(FILE *)file);
    }
    else if (text[local_1c] == L'\r') {
      fputc(0x5c,(FILE *)file);
      fputc(0x72,(FILE *)file);
    }
    else if (text[local_1c] == L'\t') {
      fputc(0x5c,(FILE *)file);
      fputc(0x74,(FILE *)file);
    }
    else {
      local_1c = UnicodeUtilities_print_wide_character_to_utf8_file
                           ((FILE_conflict *)file,text,local_1c);
    }
  }
  return;
}

Assistant:

void PrintUtilities_print_json_string(FILE* file, const wchar_t* text) {
    int i;
    for (i = 0; i < wcslen(text); ++i) {
        if (text[i] == L'\\' || text[i] == L'"') {
            fputc((char)'\\', file);
            fputc((char)text[i], file);
        }
        else if (text[i] == L'\n') {
            fputc((char)'\\', file);
            fputc((char)'n', file);
        }
        else if (text[i] == L'\r') {
            fputc((char)'\\', file);
            fputc((char)'r', file);
        }
        else if (text[i] == L'\t') {
            fputc((char)'\\', file);
            fputc((char)'t', file);
        }
        else {
            i = UnicodeUtilities_print_wide_character_to_utf8_file(file, text, i);
        }
    }
}